

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

void __thiscall
QRhiPassResourceTracker::registerTexture
          (QRhiPassResourceTracker *this,QRhiTexture *tex,TextureAccess *access,TextureStage *stage,
          UsageState *state)

{
  TextureAccess TVar1;
  TextureStage TVar2;
  undefined4 uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined4 uVar6;
  Entry *pEVar7;
  Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *pDVar8;
  ulong uVar9;
  char *pcVar10;
  TextureStage TVar11;
  uint uVar12;
  long in_FS_OFFSET;
  iterator iVar13;
  QRhiTexture *copy;
  Texture local_68;
  undefined4 local_54;
  char *local_50;
  QRhiTexture *local_48;
  QRhiTexture *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = tex;
  iVar13 = QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::findImpl<QRhiTexture*>
                     ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,
                      &local_48);
  pDVar8 = iVar13.i.d;
  if (pDVar8 == (Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *)0x0 &&
      iVar13.i.bucket == 0) {
    local_68.access = *access;
    local_68.stage = *stage;
    uVar3 = state->layout;
    uVar6 = state->access;
    local_68.stateAtPassBegin.stage = state->stage;
    local_40 = local_48;
    local_68.stateAtPassBegin.layout = uVar3;
    local_68.stateAtPassBegin.access = uVar6;
    QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::
    emplace<QRhiPassResourceTracker::Texture_const&>
              ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,&local_40,
               &local_68);
  }
  else {
    pSVar4 = pDVar8->spans;
    uVar9 = iVar13.i.bucket >> 7;
    uVar12 = (uint)iVar13.i.bucket & 0x7f;
    pEVar5 = pSVar4[uVar9].entries;
    TVar1 = *(TextureAccess *)(pEVar5[pSVar4[uVar9].offsets[uVar12]].storage.data + 8);
    if (TVar1 != *access) {
      if ((TVar1 - TexStorageLoad < 3) && (*access - TexStorageLoad < 3)) {
        pEVar7 = pEVar5 + pSVar4[uVar9].offsets[uVar12];
        (pEVar7->storage).data[8] = '\x05';
        (pEVar7->storage).data[9] = '\0';
        (pEVar7->storage).data[10] = '\0';
        (pEVar7->storage).data[0xb] = '\0';
        *access = *(TextureAccess *)(pEVar5[pSVar4[uVar9].offsets[uVar12]].storage.data + 8);
      }
      else {
        pcVar10 = (local_48->super_QRhiResource).m_objectName.d.ptr;
        if ((local_48->super_QRhiResource).m_objectName.d.d == (Data *)0x0) {
          local_68.access = TexDepthOutput;
          local_68.stage = TexVertexStage;
          local_68.stateAtPassBegin.layout = 0;
          local_68.stateAtPassBegin.access = 0;
          local_68.stateAtPassBegin.stage = 0;
          local_54 = 0;
          local_50 = "default";
          if (pcVar10 == (char *)0x0) {
            pcVar10 = (char *)&QByteArray::_empty;
          }
          QMessageLogger::warning
                    ((char *)&local_68,
                     "Texture %p (%s) used with different accesses within the same pass, this is not allowed."
                     ,local_48,pcVar10);
        }
        else {
          registerTexture();
        }
      }
    }
    pSVar4 = pDVar8->spans;
    pEVar5 = pSVar4[uVar9].entries;
    TVar2 = *(TextureStage *)(pEVar5[pSVar4[uVar9].offsets[uVar12]].storage.data + 0xc);
    TVar11 = *stage;
    if (TVar2 != TVar11) {
      if ((int)TVar2 < (int)TVar11) {
        TVar11 = TVar2;
      }
      *(TextureStage *)(pEVar5[pSVar4[uVar9].offsets[uVar12]].storage.data + 0xc) = TVar11;
      *stage = *(TextureStage *)(pEVar5[pSVar4[uVar9].offsets[uVar12]].storage.data + 0xc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiPassResourceTracker::registerTexture(QRhiTexture *tex, TextureAccess *access, TextureStage *stage,
                                              const UsageState &state)
{
    auto it = m_textures.find(tex);
    if (it != m_textures.end()) {
        if (it->access != *access) {
            // Different subresources of a texture may be used for both load
            // and store in the same pass. (think reading from one mip level
            // and writing to another one in a compute shader) This we can
            // handle by treating the entire resource as read-write.
            if (isImageLoadStore(it->access) && isImageLoadStore(*access)) {
                it->access = QRhiPassResourceTracker::TexStorageLoadStore;
                *access = it->access;
            } else {
                const QByteArray name = tex->name();
                qWarning("Texture %p (%s) used with different accesses within the same pass, this is not allowed.",
                         tex, name.constData());
            }
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Texture t;
    t.access = *access;
    t.stage = *stage;
    t.stateAtPassBegin = state; // first use -> initial state
    m_textures.insert(tex, t);
}